

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTargetLinkLibrariesCommand.cxx
# Opt level: O0

bool cmTargetLinkLibrariesCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  string_view str;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  char *pcVar1;
  ProcessingState currentProcessingState_00;
  MessageType t_00;
  cmExecutionStatus *pcVar2;
  bool bVar3;
  __type _Var4;
  PolicyStatus PVar5;
  TargetType TVar6;
  int iVar7;
  cmMakefile *pcVar8;
  const_reference pvVar9;
  cmake *this;
  cmGlobalGenerator *this_00;
  vector<std::unique_ptr<cmTarget,_std::default_delete<cmTarget>_>,_std::allocator<std::unique_ptr<cmTarget,_std::default_delete<cmTarget>_>_>_>
  *this_01;
  reference this_02;
  pointer this_03;
  ostream *poVar10;
  size_type sVar11;
  string *psVar12;
  ulong uVar13;
  size_type sVar14;
  char *pcVar15;
  PolicyID id;
  PolicyID id_00;
  PolicyID id_01;
  undefined1 auVar16 [16];
  basic_string_view<char,_std::char_traits<char>_> str_00;
  byte local_b35;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_a20;
  allocator<char> local_889;
  string local_888;
  allocator<char> local_861;
  string local_860;
  byte local_83b;
  byte local_83a;
  allocator<char> local_839;
  string local_838;
  cmValue local_818;
  PolicyStatus local_80c;
  undefined1 local_808 [4];
  PolicyStatus policy22Status;
  size_t local_7e8;
  size_t sStack_7e0;
  basic_string_view<char,_std::char_traits<char>_> local_7d8;
  size_t sStack_7c8;
  string_view cur;
  size_type pos;
  string_view arg;
  string local_798;
  allocator<char> local_771;
  string local_770;
  allocator<char> local_749;
  string local_748;
  allocator<char> local_721;
  string local_720;
  allocator<char> local_6f9;
  string local_6f8;
  allocator<char> local_6d1;
  string local_6d0;
  uint local_6ac;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_6a5;
  uint i;
  allocator<char> local_6a0;
  allocator<char> local_69f;
  allocator<char> local_69e;
  allocator<char> local_69d;
  allocator<char> local_69c;
  allocator<char> local_69b;
  allocator<char> local_69a;
  allocator<char> local_699;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_698;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_690;
  string local_670 [32];
  string local_650 [32];
  string local_630 [32];
  string local_610 [32];
  string local_5f0 [32];
  string local_5d0 [32];
  string local_5b0 [32];
  string local_590 [32];
  iterator local_570;
  size_type local_568;
  undefined1 local_560 [8];
  anon_class_8_1_76a93c77 extendCurrentEntry;
  anon_class_40_5_a08604cb processCurrentEntry;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  currentEntry;
  size_t genexNesting;
  undefined1 local_4f5;
  ProcessingState currentProcessingState;
  undefined1 local_4f0 [3];
  bool haveLLT;
  cmTargetLinkLibraryType llt;
  TLL tll;
  string local_478;
  string local_458;
  MessageType local_434;
  char *pcStack_430;
  MessageType messageType;
  char *modal;
  ostringstream e_1;
  string local_2b0;
  string local_290;
  string local_270;
  string local_250;
  undefined1 local_230 [8];
  ostringstream e;
  int local_b4;
  MessageType t;
  unique_ptr<cmTarget,_std::default_delete<cmTarget>_> *importedTarget;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::unique_ptr<cmTarget,_std::default_delete<cmTarget>_>,_std::allocator<std::unique_ptr<cmTarget,_std::default_delete<cmTarget>_>_>_>
  *__range2;
  cmTarget *target;
  string local_80;
  cmMakefile *local_60;
  cmMakefile *mf;
  allocator<char> local_41;
  string local_40;
  cmExecutionStatus *local_20;
  cmExecutionStatus *status_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  
  local_20 = status;
  status_local = (cmExecutionStatus *)args;
  bVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(args);
  pcVar2 = local_20;
  if (bVar3) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"called with incorrect number of arguments",&local_41);
    cmExecutionStatus::SetError(pcVar2,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
    args_local._7_1_ = 0;
    goto LAB_003f8a44;
  }
  pcVar8 = cmExecutionStatus::GetMakefile(local_20);
  local_60 = pcVar8;
  pvVar9 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)status_local,0);
  bVar3 = cmMakefile::IsAlias(pcVar8,pvVar9);
  pcVar2 = local_20;
  if (bVar3) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_80,"can not be used on an ALIAS target.",
               (allocator<char> *)((long)&target + 7));
    cmExecutionStatus::SetError(pcVar2,&local_80);
    std::__cxx11::string::~string((string *)&local_80);
    std::allocator<char>::~allocator((allocator<char> *)((long)&target + 7));
    args_local._7_1_ = 0;
    goto LAB_003f8a44;
  }
  this = cmMakefile::GetCMakeInstance(local_60);
  this_00 = cmake::GetGlobalGenerator(this);
  pvVar9 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)status_local,0);
  __range2 = (vector<std::unique_ptr<cmTarget,_std::default_delete<cmTarget>_>,_std::allocator<std::unique_ptr<cmTarget,_std::default_delete<cmTarget>_>_>_>
              *)cmGlobalGenerator::FindTarget(this_00,pvVar9,false);
  if (__range2 ==
      (vector<std::unique_ptr<cmTarget,_std::default_delete<cmTarget>_>,_std::allocator<std::unique_ptr<cmTarget,_std::default_delete<cmTarget>_>_>_>
       *)0x0) {
    this_01 = cmMakefile::GetOwnedImportedTargets(local_60);
    __end2 = std::
             vector<std::unique_ptr<cmTarget,_std::default_delete<cmTarget>_>,_std::allocator<std::unique_ptr<cmTarget,_std::default_delete<cmTarget>_>_>_>
             ::begin(this_01);
    importedTarget =
         (unique_ptr<cmTarget,_std::default_delete<cmTarget>_> *)
         std::
         vector<std::unique_ptr<cmTarget,_std::default_delete<cmTarget>_>,_std::allocator<std::unique_ptr<cmTarget,_std::default_delete<cmTarget>_>_>_>
         ::end(this_01);
    while (bVar3 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<const_std::unique_ptr<cmTarget,_std::default_delete<cmTarget>_>_*,_std::vector<std::unique_ptr<cmTarget,_std::default_delete<cmTarget>_>,_std::allocator<std::unique_ptr<cmTarget,_std::default_delete<cmTarget>_>_>_>_>
                                       *)&importedTarget), bVar3) {
      this_02 = __gnu_cxx::
                __normal_iterator<const_std::unique_ptr<cmTarget,_std::default_delete<cmTarget>_>_*,_std::vector<std::unique_ptr<cmTarget,_std::default_delete<cmTarget>_>,_std::allocator<std::unique_ptr<cmTarget,_std::default_delete<cmTarget>_>_>_>_>
                ::operator*(&__end2);
      this_03 = std::unique_ptr<cmTarget,_std::default_delete<cmTarget>_>::operator->(this_02);
      psVar12 = cmTarget::GetName_abi_cxx11_(this_03);
      pvVar9 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)status_local,0);
      _Var4 = std::operator==(psVar12,pvVar9);
      if (_Var4) {
        __range2 = (vector<std::unique_ptr<cmTarget,_std::default_delete<cmTarget>_>,_std::allocator<std::unique_ptr<cmTarget,_std::default_delete<cmTarget>_>_>_>
                    *)std::unique_ptr<cmTarget,_std::default_delete<cmTarget>_>::get(this_02);
        break;
      }
      __gnu_cxx::
      __normal_iterator<const_std::unique_ptr<cmTarget,_std::default_delete<cmTarget>_>_*,_std::vector<std::unique_ptr<cmTarget,_std::default_delete<cmTarget>_>,_std::allocator<std::unique_ptr<cmTarget,_std::default_delete<cmTarget>_>_>_>_>
      ::operator++(&__end2);
    }
  }
  if (__range2 ==
      (vector<std::unique_ptr<cmTarget,_std::default_delete<cmTarget>_>,_std::allocator<std::unique_ptr<cmTarget,_std::default_delete<cmTarget>_>_>_>
       *)0x0) {
    local_b4 = 2;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_230);
    poVar10 = std::operator<<((ostream *)local_230,"Cannot specify link libraries for target \"");
    pvVar9 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)status_local,0);
    poVar10 = std::operator<<(poVar10,(string *)pvVar9);
    poVar10 = std::operator<<(poVar10,"\" ");
    std::operator<<(poVar10,"which is not built by this project.");
    sVar11 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)status_local);
    if (sVar11 < 2) {
      PVar5 = cmMakefile::GetPolicyStatus(local_60,CMP0016,false);
      switch(PVar5) {
      case OLD:
        local_b4 = 4;
        break;
      case WARN:
        local_b4 = 0;
        poVar10 = std::operator<<((ostream *)local_230,"\n");
        poVar10 = std::operator<<(poVar10,
                                  "CMake does not support this but it used to work accidentally ");
        poVar10 = std::operator<<(poVar10,"and is being allowed for compatibility.");
        poVar10 = std::operator<<(poVar10,"\n");
        cmPolicies::GetPolicyWarning_abi_cxx11_(&local_250,(cmPolicies *)0x10,id);
        std::operator<<(poVar10,(string *)&local_250);
        std::__cxx11::string::~string((string *)&local_250);
        break;
      case NEW:
        break;
      case REQUIRED_IF_USED:
      case REQUIRED_ALWAYS:
        poVar10 = std::operator<<((ostream *)local_230,"\n");
        cmPolicies::GetRequiredPolicyError_abi_cxx11_(&local_270,(cmPolicies *)0x10,id_00);
        std::operator<<(poVar10,(string *)&local_270);
        std::__cxx11::string::~string((string *)&local_270);
      }
    }
    pcVar8 = local_60;
    if (local_b4 == 0) {
      std::__cxx11::ostringstream::str();
      cmMakefile::IssueMessage(pcVar8,AUTHOR_WARNING,&local_290);
      std::__cxx11::string::~string((string *)&local_290);
    }
    else if (local_b4 == 2) {
      std::__cxx11::ostringstream::str();
      cmMakefile::IssueMessage(pcVar8,FATAL_ERROR,&local_2b0);
      std::__cxx11::string::~string((string *)&local_2b0);
      cmSystemTools::SetFatalErrorOccurred();
    }
    args_local._7_1_ = 1;
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_230);
    goto LAB_003f8a44;
  }
  TVar6 = cmTarget::GetType((cmTarget *)__range2);
  if (TVar6 == UTILITY) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&modal);
    pcStack_430 = (char *)0x0;
    local_434 = AUTHOR_WARNING;
    PVar5 = cmMakefile::GetPolicyStatus(local_60,CMP0039,false);
    if (PVar5 != OLD) {
      if (PVar5 == WARN) {
        cmPolicies::GetPolicyWarning_abi_cxx11_(&local_458,(cmPolicies *)0x27,id_01);
        poVar10 = std::operator<<((ostream *)&modal,(string *)&local_458);
        std::operator<<(poVar10,"\n");
        std::__cxx11::string::~string((string *)&local_458);
        pcStack_430 = "should";
      }
      else if (PVar5 - NEW < 3) {
        pcStack_430 = "must";
        local_434 = FATAL_ERROR;
      }
    }
    if (pcStack_430 == (char *)0x0) {
LAB_003f7471:
      tll.Props._M_h._M_single_bucket._4_4_ = 0;
    }
    else {
      poVar10 = std::operator<<((ostream *)&modal,"Utility target \"");
      psVar12 = cmTarget::GetName_abi_cxx11_((cmTarget *)__range2);
      poVar10 = std::operator<<(poVar10,(string *)psVar12);
      poVar10 = std::operator<<(poVar10,"\" ");
      poVar10 = std::operator<<(poVar10,pcStack_430);
      std::operator<<(poVar10," not be used as the target of a target_link_libraries call.");
      pcVar8 = local_60;
      t_00 = local_434;
      std::__cxx11::ostringstream::str();
      cmMakefile::IssueMessage(pcVar8,t_00,&local_478);
      std::__cxx11::string::~string((string *)&local_478);
      if (local_434 != FATAL_ERROR) goto LAB_003f7471;
      args_local._7_1_ = 0;
      tll.Props._M_h._M_single_bucket._4_4_ = 1;
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&modal);
    if (tll.Props._M_h._M_single_bucket._4_4_ != 0) goto LAB_003f8a44;
  }
  sVar11 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)status_local);
  if (sVar11 < 2) {
    args_local._7_1_ = 1;
  }
  else {
    anon_unknown.dwarf_6c1348::TLL::TLL((TLL *)local_4f0,local_60,(cmTarget *)__range2);
    currentProcessingState = ProcessingLinkLibraries;
    local_4f5 = (_Alloc_hider)0x0;
    genexNesting._4_4_ = ProcessingLinkLibraries;
    currentEntry.
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_engaged = false;
    currentEntry.
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._33_7_ = 0;
    std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&processCurrentEntry.currentProcessingState);
    extendCurrentEntry.currentEntry =
         (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)&currentEntry.
             super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
             ._M_payload.
             super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
             .
             super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ._M_engaged;
    processCurrentEntry.genexNesting = (size_t *)&processCurrentEntry.currentProcessingState;
    processCurrentEntry.currentEntry =
         (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)&local_4f5;
    processCurrentEntry.haveLLT = (bool *)local_4f0;
    processCurrentEntry.tll = (TLL *)((long)&genexNesting + 4);
    local_560 = (undefined1  [8])&processCurrentEntry.currentProcessingState;
    if ((cmTargetLinkLibrariesCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
         ::keywords_abi_cxx11_ == '\0') &&
       (iVar7 = __cxa_guard_acquire(&cmTargetLinkLibrariesCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                                     ::keywords_abi_cxx11_), iVar7 != 0)) {
      i._2_1_ = 1;
      local_698 = &local_690;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_690,"LINK_INTERFACE_LIBRARIES",&local_699);
      local_698 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_670;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_670,"INTERFACE",&local_69a);
      local_698 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_650;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_650,"LINK_PUBLIC",&local_69b);
      local_698 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_630;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_630,"PUBLIC",&local_69c);
      local_698 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_610;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_610,"LINK_PRIVATE",&local_69d);
      local_698 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5f0;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_5f0,"PRIVATE",&local_69e);
      local_698 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5d0;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_5d0,"debug",&local_69f);
      local_698 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5b0;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_5b0,"optimized",&local_6a0);
      local_698 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_590;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (local_590,"general",(allocator<char> *)((long)&i + 3));
      i._2_1_ = 0;
      local_570 = &local_690;
      local_568 = 9;
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      allocator(&local_6a5);
      __l._M_len = local_568;
      __l._M_array = local_570;
      std::
      unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::unordered_set(&cmTargetLinkLibrariesCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                       ::keywords_abi_cxx11_,__l,0,(hasher *)((long)&i + 1),(key_equal *)&i,
                      &local_6a5);
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~allocator(&local_6a5);
      local_a20 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_570;
      do {
        local_a20 = local_a20 + -1;
        std::__cxx11::string::~string((string *)local_a20);
      } while (local_a20 != &local_690);
      std::allocator<char>::~allocator((allocator<char> *)((long)&i + 3));
      std::allocator<char>::~allocator(&local_6a0);
      std::allocator<char>::~allocator(&local_69f);
      std::allocator<char>::~allocator(&local_69e);
      std::allocator<char>::~allocator(&local_69d);
      std::allocator<char>::~allocator(&local_69c);
      std::allocator<char>::~allocator(&local_69b);
      std::allocator<char>::~allocator(&local_69a);
      std::allocator<char>::~allocator(&local_699);
      __cxa_atexit(std::
                   unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::~unordered_set,
                   &cmTargetLinkLibrariesCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                    ::keywords_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&cmTargetLinkLibrariesCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                           ::keywords_abi_cxx11_);
    }
    local_6ac = 1;
    while( true ) {
      uVar13 = (ulong)local_6ac;
      sVar11 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)status_local);
      if (sVar11 <= uVar13) break;
      pvVar9 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)status_local,(ulong)local_6ac);
      sVar14 = std::
               unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::count(&cmTargetLinkLibrariesCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                        ::keywords_abi_cxx11_,pvVar9);
      if (sVar14 == 0) {
        if ((local_4f5 & 1) == 0) {
          pvVar9 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)status_local,(ulong)local_6ac);
          auVar16 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)pvVar9);
          cur._M_str = (char *)0x0;
          while( true ) {
            pcVar1 = cur._M_str;
            arg._M_len = auVar16._8_8_;
            pos = auVar16._0_8_;
            pcVar15 = (char *)std::basic_string_view<char,_std::char_traits<char>_>::size
                                        ((basic_string_view<char,_std::char_traits<char>_> *)&pos);
            if (pcVar15 <= pcVar1) break;
            str_00 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                               ((basic_string_view<char,_std::char_traits<char>_> *)&pos,
                                (size_type)cur._M_str,0xffffffffffffffff);
            cur._M_len = (size_t)str_00._M_str;
            sStack_7c8 = str_00._M_len;
            local_7d8 = str_00;
            bVar3 = cmHasLiteralPrefix<3ul>(str_00,(char (*) [3])0xfd2a21);
            if (bVar3) {
              currentEntry.
              super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
              ._M_payload.
              super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
              .
              super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ._32_8_ = currentEntry.
                        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                        ._M_payload.
                        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                        .
                        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ._32_8_ + 1;
              cur._M_str = cur._M_str + 1;
            }
            else if (currentEntry.
                     super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                     ._M_payload.
                     super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                     .
                     super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ._32_8_ != 0) {
              local_7e8 = sStack_7c8;
              sStack_7e0 = cur._M_len;
              str._M_str = (char *)cur._M_len;
              str._M_len = sStack_7c8;
              bVar3 = cmHasLiteralPrefix<2ul>(str,(char (*) [2])0xfe70a8);
              if (bVar3) {
                currentEntry.
                super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                ._M_payload.
                super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                .
                super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ._32_8_ = currentEntry.
                          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                          ._M_payload.
                          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                          .
                          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ._32_8_ + -1;
              }
            }
            auVar16._8_8_ = arg._M_len;
            auVar16._0_8_ = pos;
            cur._M_str = cur._M_str + 1;
          }
          pvVar9 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)status_local,(ulong)local_6ac);
          cmTargetLinkLibrariesCommand::anon_class_8_1_76a93c77::operator()
                    ((anon_class_8_1_76a93c77 *)local_560,pvVar9);
          if (currentEntry.
              super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
              ._M_payload.
              super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
              .
              super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ._32_8_ == 0) {
            bVar3 = cmTargetLinkLibrariesCommand::anon_class_40_5_a08604cb::operator()
                              ((anon_class_40_5_a08604cb *)&extendCurrentEntry);
            if (!bVar3) {
              args_local._7_1_ = 0;
              goto LAB_003f8a10;
            }
          }
        }
        else {
          local_4f5 = (_Alloc_hider)0x0;
          bVar3 = std::optional::operator_cast_to_bool
                            ((optional *)&processCurrentEntry.currentProcessingState);
          currentProcessingState_00 = genexNesting._4_4_;
          if (((bVar3 ^ 0xffU) & 1) == 0) {
            __assert_fail("!currentEntry",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmTargetLinkLibrariesCommand.cxx"
                          ,0x143,
                          "bool cmTargetLinkLibrariesCommand(const std::vector<std::string> &, cmExecutionStatus &)"
                         );
          }
          pvVar9 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)status_local,(ulong)local_6ac);
          bVar3 = anon_unknown.dwarf_6c1348::TLL::HandleLibrary
                            ((TLL *)local_4f0,currentProcessingState_00,pvVar9,
                             currentProcessingState);
          if (!bVar3) {
            args_local._7_1_ = 0;
            goto LAB_003f8a10;
          }
          currentProcessingState = ProcessingLinkLibraries;
        }
      }
      else {
        bVar3 = cmTargetLinkLibrariesCommand::anon_class_40_5_a08604cb::operator()
                          ((anon_class_40_5_a08604cb *)&extendCurrentEntry);
        if (!bVar3) {
          args_local._7_1_ = 0;
          goto LAB_003f8a10;
        }
        pvVar9 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)status_local,(ulong)local_6ac);
        bVar3 = std::operator==(pvVar9,"LINK_INTERFACE_LIBRARIES");
        pcVar8 = local_60;
        if (bVar3) {
          genexNesting._4_4_ = ProcessingPlainLinkInterface;
          if (local_6ac != 1) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_6d0,
                       "The LINK_INTERFACE_LIBRARIES option must appear as the second argument, just after the target name."
                       ,&local_6d1);
            cmMakefile::IssueMessage(pcVar8,FATAL_ERROR,&local_6d0);
            std::__cxx11::string::~string((string *)&local_6d0);
            std::allocator<char>::~allocator(&local_6d1);
            args_local._7_1_ = 1;
            goto LAB_003f8a10;
          }
        }
        else {
          pvVar9 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)status_local,(ulong)local_6ac);
          bVar3 = std::operator==(pvVar9,"INTERFACE");
          pcVar8 = local_60;
          if (bVar3) {
            if (((local_6ac != 1) && (genexNesting._4_4_ != ProcessingKeywordPrivateInterface)) &&
               ((genexNesting._4_4_ != ProcessingKeywordPublicInterface &&
                (genexNesting._4_4_ != ProcessingKeywordLinkInterface)))) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_6f8,
                         "The INTERFACE, PUBLIC or PRIVATE option must appear as the second argument, just after the target name."
                         ,&local_6f9);
              cmMakefile::IssueMessage(pcVar8,FATAL_ERROR,&local_6f8);
              std::__cxx11::string::~string((string *)&local_6f8);
              std::allocator<char>::~allocator(&local_6f9);
              args_local._7_1_ = 1;
              goto LAB_003f8a10;
            }
            genexNesting._4_4_ = ProcessingKeywordLinkInterface;
          }
          else {
            pvVar9 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)status_local,(ulong)local_6ac);
            bVar3 = std::operator==(pvVar9,"LINK_PUBLIC");
            pcVar8 = local_60;
            if (bVar3) {
              if (((local_6ac != 1) && (genexNesting._4_4_ != ProcessingPlainPrivateInterface)) &&
                 (genexNesting._4_4_ != ProcessingPlainPublicInterface)) {
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_720,
                           "The LINK_PUBLIC or LINK_PRIVATE option must appear as the second argument, just after the target name."
                           ,&local_721);
                cmMakefile::IssueMessage(pcVar8,FATAL_ERROR,&local_720);
                std::__cxx11::string::~string((string *)&local_720);
                std::allocator<char>::~allocator(&local_721);
                args_local._7_1_ = 1;
                goto LAB_003f8a10;
              }
              genexNesting._4_4_ = ProcessingPlainPublicInterface;
            }
            else {
              pvVar9 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)status_local,(ulong)local_6ac);
              bVar3 = std::operator==(pvVar9,"PUBLIC");
              pcVar8 = local_60;
              if (bVar3) {
                if ((((local_6ac != 1) && (genexNesting._4_4_ != ProcessingKeywordPrivateInterface))
                    && (genexNesting._4_4_ != ProcessingKeywordPublicInterface)) &&
                   (genexNesting._4_4_ != ProcessingKeywordLinkInterface)) {
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_748,
                             "The INTERFACE, PUBLIC or PRIVATE option must appear as the second argument, just after the target name."
                             ,&local_749);
                  cmMakefile::IssueMessage(pcVar8,FATAL_ERROR,&local_748);
                  std::__cxx11::string::~string((string *)&local_748);
                  std::allocator<char>::~allocator(&local_749);
                  args_local._7_1_ = 1;
                  goto LAB_003f8a10;
                }
                genexNesting._4_4_ = ProcessingKeywordPublicInterface;
              }
              else {
                pvVar9 = std::
                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       *)status_local,(ulong)local_6ac);
                bVar3 = std::operator==(pvVar9,"LINK_PRIVATE");
                pcVar8 = local_60;
                if (bVar3) {
                  if (((local_6ac != 1) && (genexNesting._4_4_ != ProcessingPlainPublicInterface))
                     && (genexNesting._4_4_ != ProcessingPlainPrivateInterface)) {
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&local_770,
                               "The LINK_PUBLIC or LINK_PRIVATE option must appear as the second argument, just after the target name."
                               ,&local_771);
                    cmMakefile::IssueMessage(pcVar8,FATAL_ERROR,&local_770);
                    std::__cxx11::string::~string((string *)&local_770);
                    std::allocator<char>::~allocator(&local_771);
                    args_local._7_1_ = 1;
                    goto LAB_003f8a10;
                  }
                  genexNesting._4_4_ = ProcessingPlainPrivateInterface;
                }
                else {
                  pvVar9 = std::
                           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         *)status_local,(ulong)local_6ac);
                  bVar3 = std::operator==(pvVar9,"PRIVATE");
                  pcVar8 = local_60;
                  if (bVar3) {
                    if (((local_6ac != 1) &&
                        (genexNesting._4_4_ != ProcessingKeywordPrivateInterface)) &&
                       ((genexNesting._4_4_ != ProcessingKeywordPublicInterface &&
                        (genexNesting._4_4_ != ProcessingKeywordLinkInterface)))) {
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&local_798,
                                 "The INTERFACE, PUBLIC or PRIVATE option must appear as the second argument, just after the target name."
                                 ,(allocator<char> *)((long)&arg._M_str + 7));
                      cmMakefile::IssueMessage(pcVar8,FATAL_ERROR,&local_798);
                      std::__cxx11::string::~string((string *)&local_798);
                      std::allocator<char>::~allocator((allocator<char> *)((long)&arg._M_str + 7));
                      args_local._7_1_ = 1;
                      goto LAB_003f8a10;
                    }
                    genexNesting._4_4_ = ProcessingKeywordPrivateInterface;
                  }
                  else {
                    pvVar9 = std::
                             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           *)status_local,(ulong)local_6ac);
                    bVar3 = std::operator==(pvVar9,"debug");
                    if (bVar3) {
                      if ((local_4f5 & 1) != 0) {
                        LinkLibraryTypeSpecifierWarning(local_60,currentProcessingState,1);
                      }
                      currentProcessingState = ProcessingPlainLinkInterface;
                      local_4f5 = (_Alloc_hider)0x1;
                    }
                    else {
                      pvVar9 = std::
                               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             *)status_local,(ulong)local_6ac);
                      bVar3 = std::operator==(pvVar9,"optimized");
                      if (bVar3) {
                        if ((local_4f5 & 1) != 0) {
                          LinkLibraryTypeSpecifierWarning(local_60,currentProcessingState,2);
                        }
                        currentProcessingState = ProcessingKeywordLinkInterface;
                        local_4f5 = (_Alloc_hider)0x1;
                      }
                      else {
                        pvVar9 = std::
                                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               *)status_local,(ulong)local_6ac);
                        bVar3 = std::operator==(pvVar9,"general");
                        if (bVar3) {
                          if ((local_4f5 & 1) != 0) {
                            LinkLibraryTypeSpecifierWarning(local_60,currentProcessingState,0);
                          }
                          currentProcessingState = ProcessingLinkLibraries;
                          local_4f5 = (_Alloc_hider)0x1;
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      local_6ac = local_6ac + 1;
    }
    bVar3 = cmTargetLinkLibrariesCommand::anon_class_40_5_a08604cb::operator()
                      ((anon_class_40_5_a08604cb *)&extendCurrentEntry);
    pcVar8 = local_60;
    if (bVar3) {
      if ((local_4f5 & 1) != 0) {
        cmStrCat<char_const(&)[6],char_const*&,char_const(&)[42]>
                  ((string *)local_808,(char (*) [6])"The \"",
                   (char **)((anonymous_namespace)::LinkLibraryTypeNames +
                            (ulong)currentProcessingState * 8),
                   (char (*) [42])"\" argument must be followed by a library.");
        cmMakefile::IssueMessage(pcVar8,FATAL_ERROR,(string *)local_808);
        std::__cxx11::string::~string((string *)local_808);
        cmSystemTools::SetFatalErrorOccurred();
      }
      local_80c = cmTarget::GetPolicyStatusCMP0022((cmTarget *)__range2);
      local_83a = 0;
      local_83b = 0;
      if (((local_80c == OLD) || (local_b35 = 0, local_80c == WARN)) &&
         (local_b35 = 0, genexNesting._4_4_ != ProcessingLinkLibraries)) {
        std::allocator<char>::allocator();
        local_83a = 1;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_838,"LINK_INTERFACE_LIBRARIES",&local_839);
        local_83b = 1;
        local_818 = cmTarget::GetProperty((cmTarget *)__range2,&local_838);
        bVar3 = cmValue::operator_cast_to_bool(&local_818);
        local_b35 = bVar3 ^ 0xff;
      }
      if ((local_83b & 1) != 0) {
        std::__cxx11::string::~string((string *)&local_838);
      }
      if ((local_83a & 1) != 0) {
        std::allocator<char>::~allocator(&local_839);
      }
      if ((local_b35 & 1) != 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_860,"LINK_INTERFACE_LIBRARIES",&local_861);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_888,"",&local_889);
        cmTarget::SetProperty((cmTarget *)__range2,&local_860,&local_888);
        std::__cxx11::string::~string((string *)&local_888);
        std::allocator<char>::~allocator(&local_889);
        std::__cxx11::string::~string((string *)&local_860);
        std::allocator<char>::~allocator(&local_861);
      }
      args_local._7_1_ = 1;
    }
    else {
      args_local._7_1_ = 0;
    }
LAB_003f8a10:
    tll.Props._M_h._M_single_bucket._4_4_ = 1;
    std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&processCurrentEntry.currentProcessingState);
    anon_unknown.dwarf_6c1348::TLL::~TLL((TLL *)local_4f0);
  }
LAB_003f8a44:
  return (bool)(args_local._7_1_ & 1);
}

Assistant:

bool cmTargetLinkLibrariesCommand(std::vector<std::string> const& args,
                                  cmExecutionStatus& status)
{
  // Must have at least one argument.
  if (args.empty()) {
    status.SetError("called with incorrect number of arguments");
    return false;
  }

  cmMakefile& mf = status.GetMakefile();

  // Alias targets cannot be on the LHS of this command.
  if (mf.IsAlias(args[0])) {
    status.SetError("can not be used on an ALIAS target.");
    return false;
  }

  // Lookup the target for which libraries are specified.
  cmTarget* target =
    mf.GetCMakeInstance()->GetGlobalGenerator()->FindTarget(args[0]);
  if (!target) {
    for (const auto& importedTarget : mf.GetOwnedImportedTargets()) {
      if (importedTarget->GetName() == args[0]) {
        target = importedTarget.get();
        break;
      }
    }
  }
  if (!target) {
    MessageType t = MessageType::FATAL_ERROR; // fail by default
    std::ostringstream e;
    e << "Cannot specify link libraries for target \"" << args[0] << "\" "
      << "which is not built by this project.";
    // The bad target is the only argument. Check how policy CMP0016 is set,
    // and accept, warn or fail respectively:
    if (args.size() < 2) {
      switch (mf.GetPolicyStatus(cmPolicies::CMP0016)) {
        case cmPolicies::WARN:
          t = MessageType::AUTHOR_WARNING;
          // Print the warning.
          e << "\n"
            << "CMake does not support this but it used to work accidentally "
            << "and is being allowed for compatibility."
            << "\n"
            << cmPolicies::GetPolicyWarning(cmPolicies::CMP0016);
          break;
        case cmPolicies::OLD: // OLD behavior does not warn.
          t = MessageType::MESSAGE;
          break;
        case cmPolicies::REQUIRED_IF_USED:
        case cmPolicies::REQUIRED_ALWAYS:
          e << "\n" << cmPolicies::GetRequiredPolicyError(cmPolicies::CMP0016);
          break;
        case cmPolicies::NEW: // NEW behavior prints the error.
          break;
      }
    }
    // Now actually print the message.
    switch (t) {
      case MessageType::AUTHOR_WARNING:
        mf.IssueMessage(MessageType::AUTHOR_WARNING, e.str());
        break;
      case MessageType::FATAL_ERROR:
        mf.IssueMessage(MessageType::FATAL_ERROR, e.str());
        cmSystemTools::SetFatalErrorOccurred();
        break;
      default:
        break;
    }
    return true;
  }

  // Having a UTILITY library on the LHS is a bug.
  if (target->GetType() == cmStateEnums::UTILITY) {
    std::ostringstream e;
    const char* modal = nullptr;
    MessageType messageType = MessageType::AUTHOR_WARNING;
    switch (mf.GetPolicyStatus(cmPolicies::CMP0039)) {
      case cmPolicies::WARN:
        e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0039) << "\n";
        modal = "should";
        CM_FALLTHROUGH;
      case cmPolicies::OLD:
        break;
      case cmPolicies::REQUIRED_ALWAYS:
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::NEW:
        modal = "must";
        messageType = MessageType::FATAL_ERROR;
        break;
    }
    if (modal) {
      e << "Utility target \"" << target->GetName() << "\" " << modal
        << " not be used as the target of a target_link_libraries call.";
      mf.IssueMessage(messageType, e.str());
      if (messageType == MessageType::FATAL_ERROR) {
        return false;
      }
    }
  }

  // But we might not have any libs after variable expansion.
  if (args.size() < 2) {
    return true;
  }

  TLL tll(mf, target);

  // Keep track of link configuration specifiers.
  cmTargetLinkLibraryType llt = GENERAL_LibraryType;
  bool haveLLT = false;

  // Start with primary linking and switch to link interface
  // specification if the keyword is encountered as the first argument.
  ProcessingState currentProcessingState = ProcessingLinkLibraries;

  // Accumulate consectuive non-keyword arguments into one entry in
  // order to handle unquoted generator expressions containing ';'.
  std::size_t genexNesting = 0;
  cm::optional<std::string> currentEntry;
  auto processCurrentEntry = [&]() -> bool {
    // FIXME: Warn about partial genex if genexNesting > 0?
    genexNesting = 0;
    if (currentEntry) {
      assert(!haveLLT);
      if (!tll.HandleLibrary(currentProcessingState, *currentEntry,
                             GENERAL_LibraryType)) {
        return false;
      }
      currentEntry = cm::nullopt;
    }
    return true;
  };
  auto extendCurrentEntry = [&currentEntry](std::string const& arg) {
    if (currentEntry) {
      currentEntry = cmStrCat(*currentEntry, ';', arg);
    } else {
      currentEntry = arg;
    }
  };

  // Keep this list in sync with the keyword dispatch below.
  static std::unordered_set<std::string> const keywords{
    "LINK_INTERFACE_LIBRARIES",
    "INTERFACE",
    "LINK_PUBLIC",
    "PUBLIC",
    "LINK_PRIVATE",
    "PRIVATE",
    "debug",
    "optimized",
    "general",
  };

  // Add libraries, note that there is an optional prefix
  // of debug and optimized that can be used.
  for (unsigned int i = 1; i < args.size(); ++i) {
    if (keywords.count(args[i])) {
      // A keyword argument terminates any accumulated partial genex.
      if (!processCurrentEntry()) {
        return false;
      }

      // Process this keyword argument.
      if (args[i] == "LINK_INTERFACE_LIBRARIES") {
        currentProcessingState = ProcessingPlainLinkInterface;
        if (i != 1) {
          mf.IssueMessage(
            MessageType::FATAL_ERROR,
            "The LINK_INTERFACE_LIBRARIES option must appear as the "
            "second argument, just after the target name.");
          return true;
        }
      } else if (args[i] == "INTERFACE") {
        if (i != 1 &&
            currentProcessingState != ProcessingKeywordPrivateInterface &&
            currentProcessingState != ProcessingKeywordPublicInterface &&
            currentProcessingState != ProcessingKeywordLinkInterface) {
          mf.IssueMessage(MessageType::FATAL_ERROR,
                          "The INTERFACE, PUBLIC or PRIVATE option must "
                          "appear as the second argument, just after the "
                          "target name.");
          return true;
        }
        currentProcessingState = ProcessingKeywordLinkInterface;
      } else if (args[i] == "LINK_PUBLIC") {
        if (i != 1 &&
            currentProcessingState != ProcessingPlainPrivateInterface &&
            currentProcessingState != ProcessingPlainPublicInterface) {
          mf.IssueMessage(
            MessageType::FATAL_ERROR,
            "The LINK_PUBLIC or LINK_PRIVATE option must appear as the "
            "second argument, just after the target name.");
          return true;
        }
        currentProcessingState = ProcessingPlainPublicInterface;
      } else if (args[i] == "PUBLIC") {
        if (i != 1 &&
            currentProcessingState != ProcessingKeywordPrivateInterface &&
            currentProcessingState != ProcessingKeywordPublicInterface &&
            currentProcessingState != ProcessingKeywordLinkInterface) {
          mf.IssueMessage(MessageType::FATAL_ERROR,
                          "The INTERFACE, PUBLIC or PRIVATE option must "
                          "appear as the second argument, just after the "
                          "target name.");
          return true;
        }
        currentProcessingState = ProcessingKeywordPublicInterface;
      } else if (args[i] == "LINK_PRIVATE") {
        if (i != 1 &&
            currentProcessingState != ProcessingPlainPublicInterface &&
            currentProcessingState != ProcessingPlainPrivateInterface) {
          mf.IssueMessage(
            MessageType::FATAL_ERROR,
            "The LINK_PUBLIC or LINK_PRIVATE option must appear as the "
            "second argument, just after the target name.");
          return true;
        }
        currentProcessingState = ProcessingPlainPrivateInterface;
      } else if (args[i] == "PRIVATE") {
        if (i != 1 &&
            currentProcessingState != ProcessingKeywordPrivateInterface &&
            currentProcessingState != ProcessingKeywordPublicInterface &&
            currentProcessingState != ProcessingKeywordLinkInterface) {
          mf.IssueMessage(MessageType::FATAL_ERROR,
                          "The INTERFACE, PUBLIC or PRIVATE option must "
                          "appear as the second argument, just after the "
                          "target name.");
          return true;
        }
        currentProcessingState = ProcessingKeywordPrivateInterface;
      } else if (args[i] == "debug") {
        if (haveLLT) {
          LinkLibraryTypeSpecifierWarning(mf, llt, DEBUG_LibraryType);
        }
        llt = DEBUG_LibraryType;
        haveLLT = true;
      } else if (args[i] == "optimized") {
        if (haveLLT) {
          LinkLibraryTypeSpecifierWarning(mf, llt, OPTIMIZED_LibraryType);
        }
        llt = OPTIMIZED_LibraryType;
        haveLLT = true;
      } else if (args[i] == "general") {
        if (haveLLT) {
          LinkLibraryTypeSpecifierWarning(mf, llt, GENERAL_LibraryType);
        }
        llt = GENERAL_LibraryType;
        haveLLT = true;
      }
    } else if (haveLLT) {
      // The link type was specified by the previous argument.
      haveLLT = false;
      assert(!currentEntry);
      if (!tll.HandleLibrary(currentProcessingState, args[i], llt)) {
        return false;
      }
      llt = GENERAL_LibraryType;
    } else {
      // Track the genex nesting level.
      {
        cm::string_view arg = args[i];
        for (std::string::size_type pos = 0; pos < arg.size(); ++pos) {
          cm::string_view cur = arg.substr(pos);
          if (cmHasLiteralPrefix(cur, "$<")) {
            ++genexNesting;
            ++pos;
          } else if (genexNesting > 0 && cmHasLiteralPrefix(cur, ">")) {
            --genexNesting;
          }
        }
      }

      // Accumulate this argument in the current entry.
      extendCurrentEntry(args[i]);

      // Process this entry if it does not end inside a genex.
      if (genexNesting == 0) {
        if (!processCurrentEntry()) {
          return false;
        }
      }
    }
  }

  // Process the last accumulated partial genex, if any.
  if (!processCurrentEntry()) {
    return false;
  }

  // Make sure the last argument was not a library type specifier.
  if (haveLLT) {
    mf.IssueMessage(MessageType::FATAL_ERROR,
                    cmStrCat("The \"", LinkLibraryTypeNames[llt],
                             "\" argument must be followed by a library."));
    cmSystemTools::SetFatalErrorOccurred();
  }

  const cmPolicies::PolicyStatus policy22Status =
    target->GetPolicyStatusCMP0022();

  // If any of the LINK_ options were given, make sure the
  // LINK_INTERFACE_LIBRARIES target property exists.
  // Use of any of the new keywords implies awareness of
  // this property. And if no libraries are named, it should
  // result in an empty link interface.
  if ((policy22Status == cmPolicies::OLD ||
       policy22Status == cmPolicies::WARN) &&
      currentProcessingState != ProcessingLinkLibraries &&
      !target->GetProperty("LINK_INTERFACE_LIBRARIES")) {
    target->SetProperty("LINK_INTERFACE_LIBRARIES", "");
  }

  return true;
}